

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O3

int asn1_bit_string_length(ASN1_BIT_STRING *str,uint8_t *out_padding_bits)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = str->length;
  if ((str->flags & 8U) == 0) {
    if ((int)uVar2 < 1) {
      uVar3 = 0;
    }
    else {
      do {
        if (str->data[(ulong)uVar2 - 1] != 0) {
          uVar3 = 0;
          goto LAB_00302652;
        }
        bVar1 = 1 < (int)uVar2;
        uVar2 = uVar2 - 1;
      } while (bVar1);
      uVar3 = 0;
      uVar2 = 0;
    }
  }
  else {
    uVar3 = (uint)((byte)str->flags & 7);
    if (uVar2 == 0) {
      uVar3 = 0;
    }
  }
  goto LAB_00302660;
  while (uVar3 = uVar3 + 1, uVar3 != 7) {
LAB_00302652:
    if ((str->data[(ulong)uVar2 - 1] >> (uVar3 & 0x1f) & 1) != 0) goto LAB_00302660;
  }
  uVar3 = 7;
LAB_00302660:
  *out_padding_bits = (uint8_t)uVar3;
  return uVar2;
}

Assistant:

int asn1_bit_string_length(const ASN1_BIT_STRING *str,
                           uint8_t *out_padding_bits) {
  int len = str->length;
  if (str->flags & ASN1_STRING_FLAG_BITS_LEFT) {
    // If the string is already empty, it cannot have padding bits.
    *out_padding_bits = len == 0 ? 0 : str->flags & 0x07;
    return len;
  }

  // TODO(https://crbug.com/boringssl/447): If we move this logic to
  // |ASN1_BIT_STRING_set_bit|, can we remove this representation?
  while (len > 0 && str->data[len - 1] == 0) {
    len--;
  }
  uint8_t padding_bits = 0;
  if (len > 0) {
    uint8_t last = str->data[len - 1];
    assert(last != 0);
    for (; padding_bits < 7; padding_bits++) {
      if (last & (1 << padding_bits)) {
        break;
      }
    }
  }
  *out_padding_bits = padding_bits;
  return len;
}